

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.cpp
# Opt level: O0

MCRegister __thiscall
llvm::MCRegisterInfo::getMatchingSuperReg
          (MCRegisterInfo *this,MCRegister Reg,uint SubIdx,MCRegisterClass *RC)

{
  MCPhysReg *this_00;
  bool bVar1;
  MCRegister MVar2;
  bool local_51;
  MCRegister local_44;
  uint local_40;
  uint local_3c;
  undefined1 local_38 [8];
  MCSuperRegIterator Supers;
  MCRegisterClass *RC_local;
  uint SubIdx_local;
  MCRegisterInfo *this_local;
  MCRegister Reg_local;
  
  local_3c = Reg.Reg;
  Supers.super_DiffListIterator.List = (MCPhysReg *)RC;
  this_local._0_4_ = Reg.Reg;
  MCSuperRegIterator::MCSuperRegIterator((MCSuperRegIterator *)local_38,Reg,this,false);
  while( true ) {
    bVar1 = DiffListIterator::isValid((DiffListIterator *)local_38);
    this_00 = Supers.super_DiffListIterator.List;
    if (!bVar1) {
      MCRegister::MCRegister((MCRegister *)((long)&this_local + 4),0);
      return (MCRegister)this_local._4_4_;
    }
    local_40 = (uint)DiffListIterator::operator*((DiffListIterator *)local_38);
    bVar1 = MCRegisterClass::contains((MCRegisterClass *)this_00,(MCRegister)local_40);
    local_51 = false;
    if (bVar1) {
      MVar2 = DiffListIterator::operator*((DiffListIterator *)local_38);
      local_44 = getSubReg(this,MVar2,SubIdx);
      local_51 = MCRegister::operator==((MCRegister *)&this_local,&local_44);
    }
    if (local_51 != false) break;
    DiffListIterator::operator++((DiffListIterator *)local_38);
  }
  MVar2 = DiffListIterator::operator*((DiffListIterator *)local_38);
  return (MCRegister)MVar2.Reg;
}

Assistant:

MCRegister
MCRegisterInfo::getMatchingSuperReg(MCRegister Reg, unsigned SubIdx,
                                    const MCRegisterClass *RC) const {
  for (MCSuperRegIterator Supers(Reg, this); Supers.isValid(); ++Supers)
    if (RC->contains(*Supers) && Reg == getSubReg(*Supers, SubIdx))
      return *Supers;
  return 0;
}